

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Schema> __thiscall capnp::compiler::Compiler::Node::getBootstrapSchema(Node *this)

{
  bool bVar1;
  Impl *pIVar2;
  Workspace *pWVar3;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar4;
  Node *in_RSI;
  Maybe<capnp::Schema> MVar5;
  Schema local_48;
  Reader *local_40;
  Reader *finalSchema;
  Content *local_30;
  Content *content;
  Reader *local_20;
  Reader *schema;
  Node *this_local;
  
  this_local = this;
  local_20 = kj::_::readMaybe<capnp::schema::Node::Reader>(&in_RSI->loadedFinalSchema);
  if (local_20 == (Reader *)0x0) {
    finalSchema = (Reader *)getContent(in_RSI,BOOTSTRAP);
    local_30 = kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                         ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&finalSchema);
    if (local_30 == (Content *)0x0) {
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,(void *)0x0);
      aVar4 = extraout_RDX_03;
    }
    else if ((local_30->state == FINISHED) &&
            (bVar1 = kj::Maybe<capnp::Schema>::operator==(&local_30->bootstrapSchema,(void *)0x0),
            bVar1)) {
      local_40 = kj::_::readMaybe<capnp::schema::Node::Reader>(&local_30->finalSchema);
      if (local_40 == (Reader *)0x0) {
        kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,(void *)0x0);
        aVar4 = extraout_RDX_01;
      }
      else {
        pIVar2 = CompiledModule::getCompiler(in_RSI->module);
        pWVar3 = Compiler::Impl::getWorkspace(pIVar2);
        local_48 = SchemaLoader::loadOnce(&pWVar3->bootstrapLoader,local_40);
        kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_48);
        aVar4 = extraout_RDX_00;
      }
    }
    else {
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_30->bootstrapSchema);
      aVar4 = extraout_RDX_02;
    }
  }
  else {
    pIVar2 = CompiledModule::getCompiler(in_RSI->module);
    pWVar3 = Compiler::Impl::getWorkspace(pIVar2);
    content = (Content *)SchemaLoader::loadOnce(&pWVar3->bootstrapLoader,local_20);
    kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,(Schema *)&content);
    aVar4 = extraout_RDX;
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar5.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::getBootstrapSchema() {
  KJ_IF_MAYBE(schema, loadedFinalSchema) {
    // We don't need to rebuild the bootstrap schema if we already have a final schema.
    return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(*schema);
  } else KJ_IF_MAYBE(content, getContent(Content::BOOTSTRAP)) {
    if (content->state == Content::FINISHED && content->bootstrapSchema == nullptr) {
      // The bootstrap schema was discarded.  Copy it from the final schema.
      // (We can't just return the final schema because using it could trigger schema loader
      // callbacks that would deadlock.)
      KJ_IF_MAYBE(finalSchema, content->finalSchema) {
        return module->getCompiler().getWorkspace().bootstrapLoader.loadOnce(*finalSchema);
      } else {
        return nullptr;
      }
    } else {
      return content->bootstrapSchema;
    }
  } else {
    return nullptr;
  }
}